

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::info<char[10],int>(ConsoleLogger *this,char (*args) [10],int *args_1)

{
  int *args_local_1;
  char (*args_local) [10];
  ConsoleLogger *this_local;
  
  if (this->loglevel < 2) {
    std::mutex::lock(&this->mtx);
    if ((this->colored & 1U) != 0) {
      std::operator<<(this->out,(string *)&this->infoColor);
    }
    std::operator<<(this->out,"[i] ");
    if ((this->colored & 1U) != 0) {
      std::operator<<(this->out,"\x1b[0m");
    }
    print<char[10],int>(this,args,args_1);
    std::mutex::unlock(&this->mtx);
  }
  return;
}

Assistant:

void ConsoleLogger::info(const Args&... args)
{
	if (loglevel > 1) return;
	mtx.lock();
	if (colored) out << infoColor;
	out << "[i] ";
	if (colored) out << "\033[0m";
	print(args...);
	mtx.unlock();
}